

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiBXHelper(ndicapi *api,char *command,char *commandReply)

{
  char cVar1;
  float *pfVar2;
  float fVar3;
  int local_54;
  int local_50;
  int j_4;
  int j_3;
  int numBytes_1;
  int j_2;
  int j_1;
  int numBytes;
  ushort local_34;
  char activeStatus;
  int j;
  unsigned_short i;
  unsigned_short headerCRC;
  char *replyIndex;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *api_local;
  
  replyIndex = (char *)0x1;
  if (((command[2] == ':') && (command[7] != '\r')) || ((command[2] == ' ' && (command[3] != '\r')))
     ) {
    replyIndex = (char *)ndiHexToUnsignedLong(command + 3,4);
  }
  if ((*commandReply == -0x3c) && (commandReply[1] == -0x5b)) {
    api->BxReplyLength = *(unsigned_short *)(commandReply + 2);
    api->BxHandleCount = commandReply[6];
    _j = (float *)(commandReply + 7);
    for (local_34 = 0; local_34 < api->BxHandleCount; local_34 = local_34 + 1) {
      api->BxHandles[local_34] = *(char *)_j;
      api->BxHandlesStatus[local_34] = *(char *)((long)_j + 1);
      pfVar2 = (float *)((long)_j + 2);
      if (api->BxHandlesStatus[local_34] != '\x04') {
        if (((ulong)replyIndex & 1) != 0) {
          if (api->BxHandlesStatus[local_34] != '\x02') {
            api->BxTransforms[local_34][0] = *pfVar2;
            api->BxTransforms[local_34][1] = *(float *)((long)_j + 6);
            api->BxTransforms[local_34][2] = *(float *)((long)_j + 10);
            api->BxTransforms[local_34][3] = *(float *)((long)_j + 0xe);
            api->BxTransforms[local_34][4] = *(float *)((long)_j + 0x12);
            api->BxTransforms[local_34][5] = *(float *)((long)_j + 0x16);
            api->BxTransforms[local_34][6] = *(float *)((long)_j + 0x1a);
            api->BxTransforms[local_34][7] = *(float *)((long)_j + 0x1e);
            pfVar2 = (float *)((long)_j + 0x22);
          }
          _j = pfVar2;
          api->BxPortStatus[local_34] =
               (int)*(char *)_j | (int)*(char *)((long)_j + 1) << 8 |
               (int)*(char *)((long)_j + 2) << 0x10 | (int)*(char *)((long)_j + 3) << 0x18;
          api->BxFrameNumber[local_34] = (uint)_j[1];
          pfVar2 = _j + 2;
        }
        _j = pfVar2;
        if (((ulong)replyIndex & 2) != 0) {
          api->BxToolMarkerInformation[local_34][0] = *(char *)_j;
          for (numBytes = 0; _j = (float *)((long)_j + 1), numBytes < 10; numBytes = numBytes + 1) {
            api->BxToolMarkerInformation[local_34][numBytes + 1] = *(char *)_j;
          }
        }
        pfVar2 = _j;
        if (((ulong)replyIndex & 4) != 0) {
          cVar1 = *(char *)_j;
          api->BxActiveSingleStrayMarkerStatus[local_34] = cVar1;
          pfVar2 = (float *)((long)_j + 1);
          if (cVar1 != '\0') {
            api->BxActiveSingleStrayMarkerPosition[local_34][0] = *(float *)((long)_j + 1);
            api->BxActiveSingleStrayMarkerPosition[local_34][1] = *(float *)((long)_j + 5);
            api->BxActiveSingleStrayMarkerPosition[local_34][2] = *(float *)((long)_j + 9);
            pfVar2 = (float *)((long)_j + 0xd);
          }
        }
        _j = pfVar2;
        pfVar2 = _j;
        if (((ulong)replyIndex & 8) != 0) {
          api->Bx3DMarkerCount[local_34] = *(char *)_j;
          fVar3 = ceilf((float)(int)api->Bx3DMarkerCount[local_34] / 8.0);
          for (numBytes_1 = 0; _j = (float *)((long)_j + 1), numBytes_1 < (int)fVar3;
              numBytes_1 = numBytes_1 + 1) {
            api->Bx3DMarkerOutOfVolume[local_34][numBytes_1] = *(char *)_j;
          }
          for (j_3 = 0; pfVar2 = _j, j_3 < api->Bx3DMarkerCount[local_34]; j_3 = j_3 + 1) {
            api->Bx3DMarkerPosition[local_34][j_3][0] = *_j;
            api->Bx3DMarkerPosition[local_34][j_3][1] = _j[1];
            api->Bx3DMarkerPosition[local_34][j_3][2] = _j[2];
            _j = _j + 3;
          }
        }
      }
      _j = pfVar2;
    }
    if (((ulong)replyIndex & 0x1000) != 0) {
      api->BxPassiveStrayCount = (int)*(char *)_j;
      if (0xf0 < api->BxPassiveStrayCount) {
        api->BxPassiveStrayCount = 0xf0;
      }
      fVar3 = ceilf((float)api->BxPassiveStrayCount / 8.0);
      for (local_50 = 0; _j = (float *)((long)_j + 1), local_50 < (int)fVar3;
          local_50 = local_50 + 1) {
        api->BxPassiveStrayOutOfVolume[local_50] = *(char *)_j;
      }
      for (local_54 = 0; local_54 < api->BxPassiveStrayCount; local_54 = local_54 + 1) {
        api->BxPassiveStrayPosition[local_54][0] = *_j;
        api->BxPassiveStrayPosition[local_54][1] = _j[1];
        api->BxPassiveStrayPosition[local_54][2] = _j[2];
        _j = _j + 3;
      }
    }
    api->BxSystemStatus = (int)*(char *)((long)_j + 1) << 8 | (int)*(char *)_j;
  }
  return;
}

Assistant:

void ndiBXHelper(ndicapi* api, const char* command, const char* commandReply)
  {
    // Reply options
    // NDI_XFORMS_AND_STATUS  0x0001  /* transforms and status */
    // NDI_ADDITIONAL_INFO    0x0002  /* additional tool transform info */
    // NDI_SINGLE_STRAY       0x0004  /* stray active marker reporting */
    // NDI_FRAME_NUMBER       0x0008  /* frame number for each tool */
    // NDI_PASSIVE            0x8000  /* report passive tool information */
    // NDI_PASSIVE_EXTRA      0x2000  /* add 6 extra passive tools */
    // NDI_PASSIVE_STRAY      0x1000  /* stray passive marker reporting */
    unsigned long mode = NDI_XFORMS_AND_STATUS;
    const char* replyIndex;
    unsigned short headerCRC;

    // if the BX command had a reply option, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    replyIndex = &commandReply[0];

    // Confirm start sequence
    if (replyIndex[0] != (char)0xc4 || replyIndex[1] != (char)0xa5)  // little endian
    {
      // Something isn't right, abort
      return;
    }
    replyIndex += 2;

    // Get the reply length
    api->BxReplyLength = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the CRC
    headerCRC = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the number of handles
    api->BxHandleCount = (unsigned char)replyIndex[0];
    replyIndex += 1;

    // Go through the information for each handle
    for (unsigned short i = 0; i < api->BxHandleCount; i++)
    {
      // get the handle itself
      api->BxHandles[i] = (char)replyIndex[0];
      replyIndex++;

      api->BxHandlesStatus[i] = (char)replyIndex[0];
      replyIndex++;

      // Disabled handles have no reply data
      if (api->BxHandlesStatus[i] == NDI_HANDLE_DISABLED)
      {
        continue;
      }

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        if (api->BxHandlesStatus[i] != NDI_HANDLE_MISSING)
        {
          // 4 float, Q0, Qx, Qy, Qz
          api->BxTransforms[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][2] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][3] = *(float*)replyIndex;
          replyIndex += 4;

          // 3 float, Tx, Ty, Tz
          api->BxTransforms[i][4] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][5] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][6] = *(float*)replyIndex;
          replyIndex += 4;

          // 1 float, RMS error
          api->BxTransforms[i][7] = *(float*)replyIndex;
          replyIndex += 4;
        }
        // 4 bytes port status
        api->BxPortStatus[i] = (int)replyIndex[0] | (int)replyIndex[1] << 8 | (int)replyIndex[2] << 16 | (int)replyIndex[3] << 24;
        replyIndex += 4;
        // 4 bytes frame number
        api->BxFrameNumber[i] = (unsigned char)replyIndex[0] | (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[2] << 16 | (unsigned char)replyIndex[3] << 24;
        replyIndex += 4;
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        api->BxToolMarkerInformation[i][0] = (char)replyIndex[0];
        replyIndex++;
        for (int j = 0; j < 10; j++)
        {
          api->BxToolMarkerInformation[i][j + 1] = (char)replyIndex[0];
          replyIndex++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        char activeStatus = (char)replyIndex[0];
        replyIndex++;
        api->BxActiveSingleStrayMarkerStatus[i] = activeStatus;

        if (activeStatus != 0x00 || (mode & NDI_NOT_NORMALLY_REPORTED && activeStatus & NDI_ACTIVE_STRAY_OUT_OF_VOLUME))
        {
          // Marker is not missing, or it is out-of-volume and not-normally-requested is requested
          // Either means we have data...
          // 3 float, Tx, Ty, Tz
          api->BxActiveSingleStrayMarkerPosition[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }

      if (mode & NDI_3D_MARKER_POSITIONS)
      {
        // Save marker count
        api->Bx3DMarkerCount[i] = (char)replyIndex[0];
        replyIndex++;

        // Save off out of volume status
        int numBytes = static_cast<int>(ceilf(api->Bx3DMarkerCount[i] / 8.f));
        for (int j = 0; j < numBytes; ++j)
        {
          api->Bx3DMarkerOutOfVolume[i][j] = (char)replyIndex[0];
          ++replyIndex;
        }

        for (int j = 0; j < api->Bx3DMarkerCount[i]; ++j)
        {
          // 3 float, Tx, Ty, Tz
          api->Bx3DMarkerPosition[i][j][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // Save marker count
      api->BxPassiveStrayCount = (char)replyIndex[0];
      replyIndex++;

      if (api->BxPassiveStrayCount > 240)
      {
        // This implementation cannot report on more than 240 stray passive markers
        api->BxPassiveStrayCount = 240;
      }

      // Save off out of volume status
      int numBytes = static_cast<int>(ceilf(api->BxPassiveStrayCount / 8.f));
      for (int j = 0; j < numBytes; ++j)
      {
        api->BxPassiveStrayOutOfVolume[j] = (char)replyIndex[0];
        ++replyIndex;
      }

      for (int j = 0; j < api->BxPassiveStrayCount; ++j)
      {
        // 3 float, Tx, Ty, Tz
        api->BxPassiveStrayPosition[j][0] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][1] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][2] = *(float*)replyIndex;
        replyIndex += 4;
      }
    }

    // Get the system status
    api->BxSystemStatus = (char)replyIndex[1] << 8 | (char)replyIndex[0];
    replyIndex += 2;
  }